

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_aead_setup(aead_operation_t *operation,psa_key_handle_t handle,psa_key_usage_t usage,
              psa_algorithm_t alg)

{
  uint uVar1;
  int iVar2;
  mbedtls_cipher_info_t *pmVar3;
  byte local_48;
  uint local_44;
  int local_40;
  int local_3c;
  mbedtls_cipher_id_t local_34;
  size_t sStack_30;
  mbedtls_cipher_id_t cipher_id;
  size_t key_bits;
  psa_status_t status;
  psa_algorithm_t alg_local;
  psa_key_usage_t usage_local;
  psa_key_handle_t handle_local;
  aead_operation_t *operation_local;
  
  key_bits._4_4_ = alg;
  status = usage;
  alg_local._2_2_ = handle;
  _usage_local = operation;
  key_bits._0_4_ = psa_get_key_from_slot(handle,&operation->slot,usage,alg);
  operation_local._4_4_ = (int)key_bits;
  if ((int)key_bits == 0) {
    sStack_30 = psa_get_key_slot_bits(_usage_local->slot);
    pmVar3 = mbedtls_cipher_info_from_psa
                       (key_bits._4_4_,(_usage_local->slot->attr).type,sStack_30,&local_34);
    _usage_local->cipher_info = pmVar3;
    if (_usage_local->cipher_info == (mbedtls_cipher_info_t *)0x0) {
      operation_local._4_4_ = -0x86;
    }
    else {
      uVar1 = key_bits._4_4_ & 0xffffc0ff;
      if (uVar1 == 0x6000005) {
        _usage_local->core_alg = 0x6001005;
        _usage_local->full_tag_length = '\x10';
        if (key_bits._4_4_ != 0x6001005) {
          return -0x86;
        }
        mbedtls_chachapoly_init(&(_usage_local->ctx).chachapoly);
        iVar2 = mbedtls_chachapoly_setkey
                          (&(_usage_local->ctx).chachapoly,(_usage_local->slot->data).raw.data);
        key_bits._0_4_ = mbedtls_to_psa_error(iVar2);
      }
      else if (uVar1 == 0x6400001) {
        _usage_local->core_alg = 0x6401001;
        _usage_local->full_tag_length = '\x10';
        if (((_usage_local->slot->attr).type & 0x7000) == 0x2000) {
          local_3c = 1 << ((byte)((_usage_local->slot->attr).type >> 8) & 7);
        }
        else {
          local_3c = 0;
        }
        if (local_3c != 0x10) {
          return -0x87;
        }
        mbedtls_ccm_init(&(_usage_local->ctx).ccm);
        iVar2 = mbedtls_ccm_setkey(&(_usage_local->ctx).ccm,local_34,
                                   (_usage_local->slot->data).raw.data,(uint)sStack_30);
        key_bits._0_4_ = mbedtls_to_psa_error(iVar2);
      }
      else {
        if (uVar1 != 0x6400002) {
          return -0x86;
        }
        _usage_local->core_alg = 0x6401002;
        _usage_local->full_tag_length = '\x10';
        if (((_usage_local->slot->attr).type & 0x7000) == 0x2000) {
          local_40 = 1 << ((byte)((_usage_local->slot->attr).type >> 8) & 7);
        }
        else {
          local_40 = 0;
        }
        if (local_40 != 0x10) {
          return -0x87;
        }
        mbedtls_gcm_init(&(_usage_local->ctx).gcm);
        iVar2 = mbedtls_gcm_setkey(&(_usage_local->ctx).gcm,local_34,
                                   (_usage_local->slot->data).raw.data,(uint)sStack_30);
        key_bits._0_4_ = mbedtls_to_psa_error(iVar2);
      }
      if ((int)key_bits == 0) {
        if ((key_bits._4_4_ & 0x7f000000) == 0x6000000) {
          local_44 = (key_bits._4_4_ & 0x3f00) >> 8;
        }
        else {
          local_44 = 0;
        }
        if (local_44 <= _usage_local->full_tag_length) {
          if ((key_bits._4_4_ & 0x7f000000) == 0x6000000) {
            local_48 = (byte)(key_bits._4_4_ >> 8) & 0x3f;
          }
          else {
            local_48 = 0;
          }
          _usage_local->tag_length = local_48;
          return 0;
        }
        key_bits._0_4_ = -0x87;
      }
      psa_aead_abort_internal(_usage_local);
      operation_local._4_4_ = (int)key_bits;
    }
  }
  return operation_local._4_4_;
}

Assistant:

static psa_status_t psa_aead_setup( aead_operation_t *operation,
                                    psa_key_handle_t handle,
                                    psa_key_usage_t usage,
                                    psa_algorithm_t alg )
{
    psa_status_t status;
    size_t key_bits;
    mbedtls_cipher_id_t cipher_id;

    status = psa_get_transparent_key( handle, &operation->slot, usage, alg );
    if( status != PSA_SUCCESS )
        return( status );

    key_bits = psa_get_key_slot_bits( operation->slot );

    operation->cipher_info =
        mbedtls_cipher_info_from_psa( alg, operation->slot->attr.type, key_bits,
                                      &cipher_id );
    if( operation->cipher_info == NULL )
        return( PSA_ERROR_NOT_SUPPORTED );

    switch( PSA_ALG_AEAD_WITH_TAG_LENGTH( alg, 0 ) )
    {
#if defined(MBEDTLS_CCM_C)
        case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CCM, 0 ):
            operation->core_alg = PSA_ALG_CCM;
            operation->full_tag_length = 16;
            /* CCM allows the following tag lengths: 4, 6, 8, 10, 12, 14, 16.
             * The call to mbedtls_ccm_encrypt_and_tag or
             * mbedtls_ccm_auth_decrypt will validate the tag length. */
            if( PSA_BLOCK_CIPHER_BLOCK_SIZE( operation->slot->attr.type ) != 16 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            mbedtls_ccm_init( &operation->ctx.ccm );
            status = mbedtls_to_psa_error(
                mbedtls_ccm_setkey( &operation->ctx.ccm, cipher_id,
                                    operation->slot->data.raw.data,
                                    (unsigned int) key_bits ) );
            if( status != 0 )
                goto cleanup;
            break;
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_GCM_C)
        case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_GCM, 0 ):
            operation->core_alg = PSA_ALG_GCM;
            operation->full_tag_length = 16;
            /* GCM allows the following tag lengths: 4, 8, 12, 13, 14, 15, 16.
             * The call to mbedtls_gcm_crypt_and_tag or
             * mbedtls_gcm_auth_decrypt will validate the tag length. */
            if( PSA_BLOCK_CIPHER_BLOCK_SIZE( operation->slot->attr.type ) != 16 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            mbedtls_gcm_init( &operation->ctx.gcm );
            status = mbedtls_to_psa_error(
                mbedtls_gcm_setkey( &operation->ctx.gcm, cipher_id,
                                    operation->slot->data.raw.data,
                                    (unsigned int) key_bits ) );
            if( status != 0 )
                goto cleanup;
            break;
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
        case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CHACHA20_POLY1305, 0 ):
            operation->core_alg = PSA_ALG_CHACHA20_POLY1305;
            operation->full_tag_length = 16;
            /* We only support the default tag length. */
            if( alg != PSA_ALG_CHACHA20_POLY1305 )
                return( PSA_ERROR_NOT_SUPPORTED );
            mbedtls_chachapoly_init( &operation->ctx.chachapoly );
            status = mbedtls_to_psa_error(
                mbedtls_chachapoly_setkey( &operation->ctx.chachapoly,
                                           operation->slot->data.raw.data ) );
            if( status != 0 )
                goto cleanup;
            break;
#endif /* MBEDTLS_CHACHAPOLY_C */

        default:
            return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( PSA_AEAD_TAG_LENGTH( alg ) > operation->full_tag_length )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto cleanup;
    }
    operation->tag_length = PSA_AEAD_TAG_LENGTH( alg );

    return( PSA_SUCCESS );

cleanup:
    psa_aead_abort_internal( operation );
    return( status );
}